

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

shared_ptr<gui::MultilineTextBoxStyle> __thiscall
gui::MultilineTextBox::getStyle(MultilineTextBox *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::MultilineTextBoxStyle> sVar1;
  __shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (*(char *)(in_RSI + 0x2d0) == '\0') {
    std::make_shared<gui::MultilineTextBoxStyle,gui::MultilineTextBoxStyle_const&>
              ((MultilineTextBoxStyle *)&local_30);
    std::__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)
               (in_RSI + 0x2c0),&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    *(undefined1 *)(in_RSI + 0x2d0) = 1;
  }
  std::__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 0x2c0));
  sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::MultilineTextBoxStyle>)
         sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MultilineTextBoxStyle> MultilineTextBox::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}